

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O3

LTFlightData * __thiscall LTFlightData::operator=(LTFlightData *this,LTFlightData *fd)

{
  double dVar1;
  XPLMProbeRef pvVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->dataAccessMutex);
  if (iVar3 == 0) {
    (this->acKey).eKeyType = (fd->acKey).eKeyType;
    std::__cxx11::string::_M_assign((string *)&(this->acKey).key);
    (this->acKey).num = (fd->acKey).num;
    iVar3 = fd->sig;
    this->rcvr = fd->rcvr;
    this->sig = iVar3;
    std::__cxx11::string::_M_assign((string *)&this->labelStat);
    this->labelCfg = fd->labelCfg;
    std::deque<positionTy,_std::allocator<positionTy>_>::operator=(&this->posDeque,&fd->posDeque);
    std::deque<positionTy,_std::allocator<positionTy>_>::operator=(&this->posToAdd,&fd->posToAdd);
    std::deque<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>::operator=
              (&this->dynDataDeque,&fd->dynDataDeque);
    dVar1 = fd->youngestTS;
    this->rotateTS = fd->rotateTS;
    this->youngestTS = dVar1;
    FDStaticData::operator=(&this->statData,&fd->statData);
    pvVar2 = fd->probeRef;
    this->pAc = fd->pAc;
    this->probeRef = pvVar2;
    this->bValid = fd->bValid;
    pthread_mutex_unlock((pthread_mutex_t *)&this->dataAccessMutex);
    return this;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

LTFlightData& LTFlightData::operator=(const LTFlightData& fd)
{
    try {
        // access guarded by a mutex
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);
        // copy data
        acKey               = fd.acKey;             // key
        rcvr                = fd.rcvr;
        sig                 = fd.sig;
        labelStat           = fd.labelStat;
        labelCfg            = fd.labelCfg;
        posDeque            = fd.posDeque;          // dynamic data
        posToAdd            = fd.posToAdd;
        dynDataDeque        = fd.dynDataDeque;
        rotateTS            = fd.rotateTS;
        youngestTS          = fd.youngestTS;
        statData            = fd.statData;          // static data
        pAc                 = fd.pAc;
        probeRef            = fd.probeRef;
        bValid              = fd.bValid;
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
    return *this;
}